

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::_OnUpdate(HttpSocket *this)

{
  _Map_pointer ppRVar1;
  
  if ((((this->_inProgress == true) && (this->_chunkedTransfer == false)) && (this->_remaining == 0)
      ) && (this->_status != 0)) {
    _FinishRequest(this);
  }
  ppRVar1 = (this->_requestQ).c.
            super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((((long)(this->_requestQ).c.
               super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->_requestQ).c.
               super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) * -0x7b425ed097b425ed +
        (((long)ppRVar1 -
          (long)(this->_requestQ).c.
                super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppRVar1 == (_Map_pointer)0x0)) * 2 !=
        ((long)(this->_requestQ).c.
               super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(this->_requestQ).c.
               super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) * 0x7b425ed097b425ed) &&
      (this->_remaining == 0)) &&
     ((this->_chunkedTransfer == false && (this->_inProgress == false)))) {
    _DequeueMore(this);
  }
  return true;
}

Assistant:

bool HttpSocket::_OnUpdate()
{
    if(!TcpSocket::_OnUpdate())
        return false;

    if(_inProgress && !_chunkedTransfer && !_remaining && _status)
        _FinishRequest();

    //traceprint("HttpSocket::_OnUpdate, Q = %d\n", (unsigned)_requestQ.size());

    // initiate transfer if queue is not empty, but the socket somehow forgot to proceed
    if(_requestQ.size() && !_remaining && !_chunkedTransfer && !_inProgress)
        _DequeueMore();

    return true;
}